

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_fcompare(TCGContext_conflict8 *tcg_ctx,DisasCompare_conflict1 *cmp,uint cc,uint cond)

{
  TCGTemp *pTVar1;
  TCGv_i64 pTVar2;
  
  cmp->cond = TCG_COND_NE;
  cmp->is_bool = true;
  cmp->g1 = false;
  cmp->g2 = false;
  pTVar1 = tcg_temp_new_internal_sparc64(tcg_ctx,TCG_TYPE_I64,false);
  cmp->c1 = (TCGv_i32)((long)pTVar1 - (long)tcg_ctx);
  pTVar2 = tcg_const_i64_sparc64(tcg_ctx,0);
  cmp->c2 = (TCGv_i32)pTVar2;
  (*(code *)(&DAT_00db17e8 + *(int *)(&DAT_00db17e8 + (ulong)cond * 4)))();
  return;
}

Assistant:

static void gen_fcompare(TCGContext *tcg_ctx, DisasCompare *cmp, unsigned int cc, unsigned int cond)
{
    unsigned int offset;
    TCGv r_dst;

    /* For now we still generate a straight boolean result.  */
    cmp->cond = TCG_COND_NE;
    cmp->is_bool = true;
    cmp->g1 = cmp->g2 = false;
    cmp->c1 = r_dst = tcg_temp_new(tcg_ctx);
    cmp->c2 = tcg_const_tl(tcg_ctx, 0);

    switch (cc) {
    default:
    case 0x0:
        offset = 0;
        break;
    case 0x1:
        offset = 32 - 10;
        break;
    case 0x2:
        offset = 34 - 10;
        break;
    case 0x3:
        offset = 36 - 10;
        break;
    }

    switch (cond) {
    case 0x0:
        gen_op_eval_bn(tcg_ctx, r_dst);
        break;
    case 0x1:
        gen_op_eval_fbne(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x2:
        gen_op_eval_fblg(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x3:
        gen_op_eval_fbul(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x4:
        gen_op_eval_fbl(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x5:
        gen_op_eval_fbug(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x6:
        gen_op_eval_fbg(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x7:
        gen_op_eval_fbu(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0x8:
        gen_op_eval_ba(tcg_ctx, r_dst);
        break;
    case 0x9:
        gen_op_eval_fbe(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0xa:
        gen_op_eval_fbue(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0xb:
        gen_op_eval_fbge(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0xc:
        gen_op_eval_fbuge(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0xd:
        gen_op_eval_fble(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0xe:
        gen_op_eval_fbule(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    case 0xf:
        gen_op_eval_fbo(tcg_ctx, r_dst, tcg_ctx->cpu_fsr, offset);
        break;
    }
}